

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

uint If_DsdManCheckPrime(If_DsdMan_t *p,int iFirst,uint uMaskNot,If_DsdObj_t *pObj,int nSuppAll,
                        int LutSize,int fDerive,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vSets;
  ulong uVar3;
  uint nVars;
  uint uVar4;
  If_DsdObj_t *pIVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  If_DsdObj_t *pIVar13;
  bool bVar14;
  int pSSizes [12];
  int pFirsts [12];
  int local_98 [12];
  int local_68 [14];
  
  uVar1 = *(uint *)&pObj->field_0x4;
  uVar4 = 0xffffffff;
  if ((uVar1 & 7) == 6 && 0x17ffffff < uVar1) {
    uVar4 = pObj->Id;
    if (((long)(int)uVar4 < 0) || ((p->vTruths).nSize <= (int)uVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar4 = (p->vTruths).pArray[(int)uVar4];
  }
  if (-1 < (int)uVar4) {
    nVars = uVar1 >> 0x1b;
    uVar3 = (ulong)nVars;
    if ((int)uVar4 < p->vTtDecs[uVar3]->nSize) {
      vSets = (Vec_Int_t *)p->vTtDecs[uVar3]->pArray[uVar4];
      if (fVerbose != 0) {
        putchar(10);
        Dau_DecPrintSets(vSets,nVars);
      }
      if (*(uint *)&pObj->field_0x4 < 0x18000000) {
        __assert_fail("If_DsdObjFaninNum(pObj) > 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                      ,0x766,
                      "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                     );
      }
      if ((int)(*(uint *)&pObj->field_0x4 >> 3 & 0x1f) <= LutSize) {
        __assert_fail("If_DsdObjSuppSize(pObj) > LutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                      ,0x767,
                      "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                     );
      }
      If_DsdManGetSuppSizes(p,pObj,local_98);
      iVar11 = ~nSuppAll + LutSize + (*(uint *)&pObj->field_0x4 >> 3 & 0x1f);
      if (LutSize <= iVar11) {
        __assert_fail("LimitOut < LutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                      ,0x76a,
                      "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                     );
      }
      if (0 < vSets->nSize) {
        lVar9 = 0;
        pIVar5 = pObj + 1;
        do {
          iVar2 = vSets->pArray[lVar9];
          uVar12 = 0;
          if (0x7ffffff < uVar1) {
            bVar6 = 0;
            uVar10 = 0;
            iVar7 = 0;
            iVar8 = 0;
            do {
              switch(iVar2 >> (bVar6 & 0x1f) & 3) {
              case 0:
                iVar8 = iVar8 + local_98[uVar10];
                break;
              case 1:
                iVar7 = iVar7 + local_98[uVar10];
                break;
              case 2:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                              ,0x77a,
                              "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                             );
              case 3:
                iVar7 = iVar7 + local_98[uVar10];
                iVar8 = iVar8 + local_98[uVar10];
              }
              uVar12 = uVar10;
              if ((LutSize < iVar7) || (iVar11 < iVar8)) break;
              uVar10 = uVar10 + 1;
              bVar6 = bVar6 + 2;
              uVar12 = uVar3;
            } while (uVar3 != uVar10);
          }
          if ((uint)uVar12 == nVars) {
            pIVar13 = (If_DsdObj_t *)0x0;
            if (fDerive == 0) {
              bVar14 = false;
              pIVar5 = (If_DsdObj_t *)0xffffffff;
            }
            else {
              If_DsdManComputeFirstArray
                        (p,(int *)(pObj + 1),*(uint *)&pObj->field_0x4 >> 0x1b,local_68);
              if (0x7ffffff < uVar1) {
                bVar6 = 0;
                uVar12 = 0;
                pIVar13 = (If_DsdObj_t *)0x0;
                do {
                  iVar7 = 0;
                  switch(iVar2 >> (bVar6 & 0x1f) & 3) {
                  case 2:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                                  ,0x78d,
                                  "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                                 );
                  case 3:
                    iVar7 = 1;
                  case 1:
                    uVar4 = If_DsdSign(p,pObj,(int)uVar12,local_68[uVar12] + iFirst,iVar7);
                    pIVar13 = (If_DsdObj_t *)(ulong)((uint)pIVar13 | uVar4);
                  }
                  uVar12 = uVar12 + 1;
                  bVar6 = bVar6 + 2;
                } while (uVar3 != uVar12);
              }
              bVar14 = (uMaskNot & (uint)pIVar13) != 0;
              pIVar5 = (If_DsdObj_t *)((ulong)pIVar5 & 0xffffffff);
              if (!bVar14) {
                pIVar5 = pIVar13;
              }
            }
            if (!bVar14) {
              return (uint)pIVar5;
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < vSets->nSize);
      }
      return 0;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

unsigned If_DsdManCheckPrime( If_DsdMan_t * p, int iFirst, unsigned uMaskNot, If_DsdObj_t * pObj, int nSuppAll, int LutSize, int fDerive, int fVerbose )
{
    int i, v, set, LimitOut, SizeIn, SizeOut, pSSizes[DAU_MAX_VAR], pFirsts[DAU_MAX_VAR];
    int truthId = If_DsdObjTruthId(p, pObj);
    int nFans = If_DsdObjFaninNum(pObj);
    Vec_Int_t * vSets = (Vec_Int_t *)Vec_PtrEntry(p->vTtDecs[pObj->nFans], truthId);
if ( fVerbose )
printf( "\n" );
if ( fVerbose )
Dau_DecPrintSets( vSets, nFans );
    assert( If_DsdObjFaninNum(pObj) > 2 );
    assert( If_DsdObjSuppSize(pObj) > LutSize );
    If_DsdManGetSuppSizes( p, pObj, pSSizes );
    LimitOut = LutSize - (nSuppAll - If_DsdObjSuppSize(pObj) + 1);
    assert( LimitOut < LutSize );
    Vec_IntForEachEntry( vSets, set, i )
    {
        SizeIn = SizeOut = 0;
        for ( v = 0; v < nFans; v++ )
        {
            int Value = ((set >> (v << 1)) & 3);
            if ( Value == 0 )
                SizeOut += pSSizes[v];
            else if ( Value == 1 )
                SizeIn += pSSizes[v];
            else if ( Value == 3 )
            {
                SizeIn += pSSizes[v];
                SizeOut += pSSizes[v];
            }
            else assert( 0 );
            if ( SizeIn > LutSize || SizeOut > LimitOut )
                break;
        }
        if ( v == nFans )
        {
            unsigned uRes = 0;
            if ( !fDerive )
                return ~0;
            If_DsdManComputeFirst( p, pObj, pFirsts );
            for ( v = 0; v < nFans; v++ )
            {
                int Value = ((set >> (v << 1)) & 3);
                if ( Value == 0 )
                {}
                else if ( Value == 1 )
                    uRes |= If_DsdSign(p, pObj, v, iFirst + pFirsts[v], 0);
                else if ( Value == 3 )
                    uRes |= If_DsdSign(p, pObj, v, iFirst + pFirsts[v], 1);
                else assert( 0 );
            }
            if ( uRes & uMaskNot )
                continue;
            return uRes;
        }
    }
    return 0;
}